

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O1

void outputProblemToLaTeX(Problem *prb)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Unit **ppUVar2;
  ostream *poVar3;
  uint index;
  UnitList *pUVar4;
  LaTeX latex;
  ofstream latexOut;
  LaTeX local_249;
  string local_248;
  long local_228;
  filebuf local_220 [240];
  ios_base local_130 [264];
  
  paVar1 = &local_248.field_2;
  local_248._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,*(long *)(Lib::env + 0x6a70),
             *(long *)(Lib::env + 0x6a78) + *(long *)(Lib::env + 0x6a70));
  std::ofstream::ofstream(&local_228,local_248._M_dataplus._M_p,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  Shell::LaTeX::header_abi_cxx11_(&local_248,&local_249);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_228,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,"\\section{Problem ",0x11);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_228,*(char **)(Lib::env + 0x82d8),
                      *(long *)(Lib::env + 0x82e0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_228,"\\[\n\\begin{array}{ll}",0x14);
  std::ios::widen((char)(ostream *)&local_228 + (char)*(undefined8 *)(local_228 + -0x18));
  std::ostream::put((char)&local_228);
  std::ostream::flush();
  pUVar4 = prb->_units;
  if (pUVar4 != (UnitList *)0x0) {
    index = 0;
    do {
      ppUVar2 = &pUVar4->_head;
      pUVar4 = pUVar4->_tail;
      outputUnitToLaTeX(&local_249,(ofstream *)&local_228,*ppUVar2,index);
      index = index + 1;
    } while (pUVar4 != (List<Kernel::Unit_*> *)0x0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_228,"\\end{array}\n\\]",0xe);
  Shell::LaTeX::footer_abi_cxx11_(&local_248,&local_249);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_228,local_248._M_dataplus._M_p,local_248._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != paVar1) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_228 = _VTT;
  *(undefined8 *)(local_220 + *(long *)(_VTT + -0x18) + -8) = _roundf;
  std::filebuf::~filebuf(local_220);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void outputProblemToLaTeX(Problem* prb)
{
  ASS(env.options->latexOutput()!="off");

  LaTeX latex;
  ofstream latexOut(env.options->latexOutput().c_str());
  latexOut << latex.header() << endl;
  latexOut << "\\section{Problem "<<env.options->problemName() << "}" << endl;
  //TODO output more header
  latexOut << "\\[\n\\begin{array}{ll}" << endl;

  //TODO  get symbol and sort declarations into LaTeX

  UnitList::Iterator units(prb->units());

  unsigned index = 0;
  while (units.hasNext()) {
    Unit* u = units.next();
    outputUnitToLaTeX(latex,latexOut,u,index++);
  }
  latexOut  << "\\end{array}\n\\]" << latex.footer() << "\n";

  //close ofstream?
}